

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void duckdb::QuantileListOperation<duckdb::dtime_t,false>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  FunctionData *pFVar2;
  data_ptr_t pdVar3;
  _func_int **pp_Var4;
  Vector *pVVar5;
  idx_t iVar6;
  reference pvVar7;
  dtime_t dVar8;
  unsigned_long *q;
  _func_int **pp_Var9;
  uint64_t uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  Interpolator<false> interp;
  QuantileDirect<duckdb::dtime_t> local_a9;
  list_entry_t *local_a8;
  AggregateFinalizeData *local_a0;
  data_ptr_t local_98;
  vector<duckdb::QuantileValue,_true> *local_90;
  pointer local_88;
  Vector *local_80;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  
  if ((state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
      super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
      super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar2 = (this->bind_data).ptr;
    pVVar5 = ListVector::GetEntry(finalize_data->result);
    iVar6 = ListVector::GetListSize(finalize_data->result);
    local_a0 = finalize_data;
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar2[2]._vptr_FunctionData - (long)pFVar2[1]._vptr_FunctionData >>
                        3) * 0x4ec4ec4ec4ec4ec5 + iVar6);
    pdVar3 = pVVar5->data;
    local_88 = (state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
               super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
               super__Vector_impl_data._M_start;
    target->offset = iVar6;
    pp_Var9 = pFVar2[4]._vptr_FunctionData;
    pp_Var4 = pFVar2[5]._vptr_FunctionData;
    local_a8 = target;
    local_80 = pVVar5;
    if (pp_Var9 != pp_Var4) {
      local_90 = (vector<duckdb::QuantileValue,_true> *)(pFVar2 + 1);
      local_98 = pdVar3 + iVar6 * 8;
      uVar11 = 0;
      do {
        pvVar7 = vector<duckdb::QuantileValue,_true>::operator[](local_90,(size_type)*pp_Var9);
        iVar6 = (long)(state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
                      super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
                      super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        local_78.desc = *(bool *)&pFVar2[7]._vptr_FunctionData;
        lVar1 = iVar6 - 1;
        auVar13._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar13._0_8_ = lVar1;
        auVar13._12_4_ = 0x45300000;
        dStack_40 = auVar13._8_8_ - 1.9342813113834067e+25;
        local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                      pvVar7->dbl;
        local_48 = local_78.RN;
        dVar12 = floor(local_78.RN);
        local_78.FRN = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
        dVar12 = ceil(local_48);
        local_78.CRN = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
        local_78.begin = uVar11;
        local_78.end = iVar6;
        dVar8 = Interpolator<false>::
                Operation<duckdb::dtime_t,duckdb::dtime_t,duckdb::QuantileDirect<duckdb::dtime_t>>
                          (&local_78,local_88,local_80,&local_a9);
        *(int64_t *)(local_98 + (long)*pp_Var9 * 8) = dVar8.micros;
        pp_Var9 = pp_Var9 + 1;
        uVar11 = local_78.FRN;
      } while (pp_Var9 != pp_Var4);
    }
    uVar10 = ((long)pFVar2[2]._vptr_FunctionData - (long)pFVar2[1]._vptr_FunctionData >> 3) *
             0x4ec4ec4ec4ec4ec5;
    local_a8->length = uVar10;
    ListVector::SetListSize(local_a0->result,uVar10 + local_a8->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}